

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_internal.h
# Opt level: O0

void __thiscall ImPlotAxis::SetRange(ImPlotAxis *this,double _min,double _max)

{
  ImPlotTime IVar1;
  double _max_local;
  double _min_local;
  ImPlotAxis *this_local;
  
  (this->Range).Min = _min;
  (this->Range).Max = _max;
  Constrain(this);
  IVar1 = ImPlotTime::FromDouble((this->Range).Min);
  (this->PickerTimeMin).Us = IVar1.Us;
  (this->PickerTimeMin).S = IVar1.S;
  IVar1 = ImPlotTime::FromDouble((this->Range).Max);
  (this->PickerTimeMax).S = IVar1.S;
  (this->PickerTimeMax).Us = IVar1.Us;
  return;
}

Assistant:

void SetRange(double _min, double _max) {
        Range.Min = _min;
        Range.Max = _max;
        Constrain();
        PickerTimeMin = ImPlotTime::FromDouble(Range.Min);
        PickerTimeMax = ImPlotTime::FromDouble(Range.Max);
    }